

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unixDelete(unqlite_vfs *NotUsed,char *zPath,int dirSync)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  int *piVar3;
  int fd;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = unlink(zPath);
  if ((iVar1 == -1) && (piVar3 = __errno_location(), *piVar3 != 2)) {
    return -2;
  }
  if (dirSync == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = openDirectory(zPath,&local_14);
    if (iVar1 == 0) {
      iVar1 = fsync(local_14);
      iVar2 = close(local_14);
      iVar1 = (uint)(iVar2 == 0 && iVar1 == 0) * 2 + -2;
    }
  }
  return iVar1;
}

Assistant:

static int unixDelete(
  unqlite_vfs *NotUsed,     /* VFS containing this as the xDelete method */
  const char *zPath,        /* Name of file to be deleted */
  int dirSync               /* If true, fsync() directory after deleting file */
){
  int rc = UNQLITE_OK;
  SXUNUSED(NotUsed);
  
  if( unlink(zPath)==(-1) && errno!=ENOENT ){
	  return UNQLITE_IOERR;
  }
#ifndef UNQLITE_DISABLE_DIRSYNC
  if( dirSync ){
    int fd;
    rc = openDirectory(zPath, &fd);
    if( rc==UNQLITE_OK ){
      if( fsync(fd) )
      {
        rc = UNQLITE_IOERR;
      }
      if( close(fd) && !rc ){
        rc = UNQLITE_IOERR;
      }
    }
  }
#endif
  return rc;
}